

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcSetGlobal(char *name,void *data)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    pvVar5 = nullcGetVariableData((uint *)0x0);
    auVar11._0_4_ = -(uint)(name == (char *)0x0);
    auVar11._4_4_ = -(uint)((int)NULLC::linker == 0 && NULLC::linker._4_4_ == 0);
    auVar11._8_4_ = -(uint)(data == (void *)0x0);
    auVar11._12_4_ = -(uint)((int)pvVar5 == 0 && (int)((ulong)pvVar5 >> 0x20) == 0);
    iVar3 = movmskps((int)pvVar5,auVar11);
    if (iVar3 != 0) {
      return '\0';
    }
    uVar4 = NULLC::GetStringHash(name);
    lVar2 = CONCAT44(NULLC::linker._4_4_,(int)NULLC::linker);
    uVar6 = (ulong)*(uint *)(lVar2 + 0x23c);
    if (uVar6 != 0) {
      lVar8 = *(long *)(lVar2 + 0x230);
      bVar10 = true;
      if (*(uint *)(lVar8 + 4) != uVar4) {
        uVar9 = 0;
        lVar7 = lVar8;
        do {
          if (uVar6 - 1 == uVar9) {
            return '\0';
          }
          lVar8 = lVar7 + 0x10;
          uVar9 = uVar9 + 1;
          puVar1 = (uint *)(lVar7 + 0x14);
          lVar7 = lVar8;
        } while (*puVar1 != uVar4);
        bVar10 = uVar9 < uVar6;
      }
      if (*(uint *)(lVar2 + 0x20c) <= *(uint *)(lVar8 + 8)) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      memcpy((void *)((long)pvVar5 + (ulong)*(uint *)(lVar8 + 0xc)),data,
             (ulong)*(uint *)(*(long *)(lVar2 + 0x200) + 4 + (ulong)*(uint *)(lVar8 + 8) * 0x50));
      return bVar10;
    }
  }
  return '\0';
}

Assistant:

nullres nullcSetGlobal(const char* name, void* data)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !data || !mem)
		return 0;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
		{
			memcpy(mem + linker->exVariables[i].offset, data, linker->exTypes[linker->exVariables[i].type].size);
			return 1;
		}
	}
	return 0;
}